

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

double u_getNumericValue_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int32_t denominator_1;
  int32_t numerator_1;
  int32_t frac20;
  int32_t exp_1;
  int32_t numValue_1;
  int32_t exp;
  int32_t mant;
  double numValue;
  int32_t denominator;
  int32_t numerator;
  int32_t ntv;
  uint32_t props;
  UChar32 c_local;
  
  uVar1 = c >> 5;
  if ((uint)c < 0xd800) {
    local_5c = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar2 = 0;
      if (c < 0xdc00) {
        iVar2 = 0x140;
      }
      local_60 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0x110000) {
          local_68 = (uint)propsTrie_index
                           [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_68 = 0x53c8;
        }
        local_64 = local_68;
      }
      else {
        local_64 = 0x11f4;
      }
      local_60 = local_64;
    }
    local_5c = local_60;
  }
  uVar1 = (uint)(propsTrie_index[local_5c] >> 6);
  if (uVar1 == 0) {
    _props = -123456789.0;
  }
  else if (uVar1 < 0xb) {
    _props = (double)(int)(uVar1 - 1);
  }
  else if (uVar1 < 0x15) {
    _props = (double)(int)(uVar1 - 0xb);
  }
  else if (uVar1 < 0xb0) {
    _props = (double)(int)(uVar1 - 0x15);
  }
  else if (uVar1 < 0x1e0) {
    _props = (double)(((int)uVar1 >> 4) + -0xc) / (double)((uVar1 & 0xf) + 1);
  }
  else if (uVar1 < 0x300) {
    _exp = (double)(((int)uVar1 >> 5) + -0xe);
    for (exp_1 = (uVar1 & 0x1f) + 2; 3 < exp_1; exp_1 = exp_1 + -4) {
      _exp = _exp * 10000.0;
    }
    switch(exp_1) {
    case 0:
      break;
    case 1:
      _exp = _exp * 10.0;
      break;
    case 2:
      _exp = _exp * 100.0;
      break;
    case 3:
      _exp = _exp * 1000.0;
    }
    _props = _exp;
  }
  else if (uVar1 < 0x324) {
    frac20 = ((int)uVar1 >> 2) + -0xbf;
    if ((uVar1 & 3) + 1 < 5) {
      switch(uVar1 & 3) {
      case 0:
        frac20 = frac20 * 0x3c;
        break;
      case 1:
        frac20 = frac20 * 0xe10;
        break;
      case 2:
        frac20 = frac20 * 0x34bc0;
        break;
      case 3:
        frac20 = frac20 * 0xc5c100;
      }
    }
    _props = (double)frac20;
  }
  else if (uVar1 < 0x33c) {
    _props = (double)((uVar1 - 0x324 & 3) * 2 + 1) /
             (double)(0x14 << ((byte)((int)(uVar1 - 0x324) >> 2) & 0x1f));
  }
  else {
    _props = -123456789.0;
  }
  return _props;
}

Assistant:

U_CAPI double U_EXPORT2
u_getNumericValue(UChar32 c) {
    uint32_t props;
    int32_t ntv;
    GET_PROPS(c, props);
    ntv=(int32_t)GET_NUMERIC_TYPE_VALUE(props);

    if(ntv==UPROPS_NTV_NONE) {
        return U_NO_NUMERIC_VALUE;
    } else if(ntv<UPROPS_NTV_DIGIT_START) {
        /* decimal digit */
        return ntv-UPROPS_NTV_DECIMAL_START;
    } else if(ntv<UPROPS_NTV_NUMERIC_START) {
        /* other digit */
        return ntv-UPROPS_NTV_DIGIT_START;
    } else if(ntv<UPROPS_NTV_FRACTION_START) {
        /* small integer */
        return ntv-UPROPS_NTV_NUMERIC_START;
    } else if(ntv<UPROPS_NTV_LARGE_START) {
        /* fraction */
        int32_t numerator=(ntv>>4)-12;
        int32_t denominator=(ntv&0xf)+1;
        return (double)numerator/denominator;
    } else if(ntv<UPROPS_NTV_BASE60_START) {
        /* large, single-significant-digit integer */
        double numValue;
        int32_t mant=(ntv>>5)-14;
        int32_t exp=(ntv&0x1f)+2;
        numValue=mant;

        /* multiply by 10^exp without math.h */
        while(exp>=4) {
            numValue*=10000.;
            exp-=4;
        }
        switch(exp) {
        case 3:
            numValue*=1000.;
            break;
        case 2:
            numValue*=100.;
            break;
        case 1:
            numValue*=10.;
            break;
        case 0:
        default:
            break;
        }

        return numValue;
    } else if(ntv<UPROPS_NTV_FRACTION20_START) {
        /* sexagesimal (base 60) integer */
        int32_t numValue=(ntv>>2)-0xbf;
        int32_t exp=(ntv&3)+1;

        switch(exp) {
        case 4:
            numValue*=60*60*60*60;
            break;
        case 3:
            numValue*=60*60*60;
            break;
        case 2:
            numValue*=60*60;
            break;
        case 1:
            numValue*=60;
            break;
        case 0:
        default:
            break;
        }

        return numValue;
    } else if(ntv<UPROPS_NTV_RESERVED_START) {
        // fraction-20 e.g. 3/80
        int32_t frac20=ntv-UPROPS_NTV_FRACTION20_START;  // 0..0x17
        int32_t numerator=2*(frac20&3)+1;
        int32_t denominator=20<<(frac20>>2);
        return (double)numerator/denominator;
    } else {
        /* reserved */
        return U_NO_NUMERIC_VALUE;
    }
}